

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

PackageImportDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::PackageImportDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::syntax::SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax>const&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,SeparatedSyntaxList<slang::syntax::PackageImportItemSyntax> *args_2,
          Token *args_3)

{
  Token keyword;
  Token semi;
  PackageImportDeclarationSyntax *this_00;
  
  this_00 = (PackageImportDeclarationSyntax *)
            ((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((PackageImportDeclarationSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (PackageImportDeclarationSyntax *)allocateSlow(this,0xa8,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  keyword.kind = args_1->kind;
  keyword._2_1_ = args_1->field_0x2;
  keyword.numFlags.raw = (args_1->numFlags).raw;
  keyword.rawLen = args_1->rawLen;
  keyword.info = args_1->info;
  semi.kind = args_3->kind;
  semi._2_1_ = args_3->field_0x2;
  semi.numFlags.raw = (args_3->numFlags).raw;
  semi.rawLen = args_3->rawLen;
  semi.info = args_3->info;
  slang::syntax::PackageImportDeclarationSyntax::PackageImportDeclarationSyntax
            (this_00,args,keyword,args_2,semi);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }